

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_function_prototype
          (CompilerMSL *this,SPIRFunction *func,Bitset *param_2)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint uVar1;
  size_t sVar2;
  uint *puVar3;
  Variant *pVVar4;
  undefined8 uVar5;
  bool bVar6;
  uint32_t uVar7;
  SPIRType *pSVar8;
  SPIRVariable *pSVar9;
  MSLConstexprSampler *pMVar10;
  size_type sVar11;
  char (*pacVar12) [16];
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  _Hash_node_base *p_Var13;
  long lVar14;
  ulong uVar15;
  __hashtable *__h;
  Parameter *arg;
  bool bVar16;
  __node_gen_type __node_gen;
  string decl;
  char *sampler_address_space;
  _Alloc_hider in_stack_ffffffffffffff20;
  undefined1 local_d0 [32];
  undefined8 local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  ulong local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Parameter *local_50;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  char *local_38;
  
  if ((func->super_IVariant).self.id !=
      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  this_00 = &(this->super_CompilerGLSL).local_variable_names;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this_00,&(this->super_CompilerGLSL).resource_names._M_h);
  local_d0._24_8_ = &local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  bVar16 = (func->super_IVariant).self.id ==
           (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id;
  (this->super_CompilerGLSL).processing_entry_point = bVar16;
  if (!bVar16) {
    CompilerGLSL::statement<char_const*&>(&this->super_CompilerGLSL,&force_inline);
  }
  local_d0._16_8_ = func;
  pSVar8 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(func->super_IVariant).field_0xc);
  if (((pSVar8->array).super_VectorView<unsigned_int>.buffer_size == 0) ||
     ((this->msl_options).force_native_arrays != true)) {
    func_type_decl_abi_cxx11_((string *)&stack0xffffffffffffff20,this,pSVar8);
    ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_ffffffffffffff20._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
      operator_delete(in_stack_ffffffffffffff20._M_p);
    }
  }
  else {
    ::std::__cxx11::string::append(local_d0 + 0x18);
  }
  ::std::__cxx11::string::append(local_d0 + 0x18);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&stack0xffffffffffffff20,this,(ulong)((ID *)(local_d0._16_8_ + 8))->id,1);
  ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      in_stack_ffffffffffffff20._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
    operator_delete(in_stack_ffffffffffffff20._M_p);
  }
  ::std::__cxx11::string::append(local_d0 + 0x18);
  if (((pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 0) &&
     ((this->msl_options).force_native_arrays == true)) {
    ::std::__cxx11::string::append(local_d0 + 0x18);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (&stack0xffffffffffffff20,this,pSVar8,0);
    ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_ffffffffffffff20._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
      operator_delete(in_stack_ffffffffffffff20._M_p);
    }
    ::std::__cxx11::string::append(local_d0 + 0x18);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])
              (&stack0xffffffffffffff20,this,pSVar8);
    ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p);
    uVar5 = local_d0._16_8_;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_ffffffffffffff20._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
      operator_delete(in_stack_ffffffffffffff20._M_p);
    }
    if (*(size_t *)(uVar5 + 0x20) != 0) {
      ::std::__cxx11::string::append(local_d0 + 0x18);
    }
  }
  if ((this->super_CompilerGLSL).processing_entry_point == true) {
    if ((this->msl_options).argument_buffers == true) {
      entry_point_args_argument_buffer_abi_cxx11_
                ((string *)&stack0xffffffffffffff20,this,*(size_t *)(local_d0._16_8_ + 0x20) != 0);
      ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p);
    }
    else {
      entry_point_args_classic_abi_cxx11_
                ((string *)&stack0xffffffffffffff20,this,*(size_t *)(local_d0._16_8_ + 0x20) != 0);
      ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_ffffffffffffff20._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
      operator_delete(in_stack_ffffffffffffff20._M_p);
    }
    p_Var13 = (this->super_CompilerGLSL).resource_names._M_h._M_before_begin._M_nxt;
    in_stack_ffffffffffffff20._M_p = (pointer)this_00;
    if (p_Var13 != (_Hash_node_base *)0x0) {
      do {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this_00,p_Var13 + 1,&stack0xffffffffffffff20);
        p_Var13 = p_Var13->_M_nxt;
      } while (p_Var13 != (_Hash_node_base *)0x0);
    }
    sVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
    if (sVar2 != 0) {
      puVar3 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr;
      lVar14 = 0;
      do {
        pSVar9 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)((long)puVar3 + lVar14));
        if ((pSVar9->initializer).id == 0) {
          uVar7 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          (pSVar9->initializer).id = uVar7;
        }
        uVar1 = (pSVar9->initializer).id;
        if (((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>
             .ptr[uVar1].type & ~TypeExpression) == TypeNone) {
          in_stack_ffffffffffffff20._M_p._1_7_ =
               (undefined7)((ulong)in_stack_ffffffffffffff20._M_p >> 8);
          in_stack_ffffffffffffff20._M_p._0_1_ = 1;
          in_R8 = (string *)&stack0xffffffffffffff20;
          Compiler::
          set<spirv_cross::SPIRExpression,char_const(&)[3],spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                    ((Compiler *)this,uVar1,(char (*) [3])0x3589c5,
                     (TypedID<(spirv_cross::Types)1> *)&(pSVar9->super_IVariant).field_0xc,
                     (bool *)in_R8);
        }
        lVar14 = lVar14 + 4;
      } while (sVar2 << 2 != lVar14);
    }
  }
  if (*(size_t *)(local_d0._16_8_ + 0x20) != 0) {
    arg = (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)(local_d0._16_8_ + 0x18))->
          super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr;
    local_50 = arg + *(size_t *)(local_d0._16_8_ + 0x20);
    local_40 = &this->plane_name_suffix;
    local_48 = &(this->buffers_requiring_array_length)._M_h;
    do {
      uVar15 = (ulong)(arg->id).id;
      if ((uVar15 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar4[uVar15].type == TypeVariable))
      {
        pSVar9 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar15);
      }
      else {
        pSVar9 = (SPIRVariable *)0x0;
      }
      if (pSVar9 != (SPIRVariable *)0x0) {
        if ((arg->alias_global_variable == true) && (uVar1 = (pSVar9->basevariable).id, uVar1 != 0))
        {
          uVar15 = (ulong)uVar1;
        }
        pSVar9->parameter = arg;
      }
      CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(uint32_t)uVar15);
      argument_decl_abi_cxx11_((string *)&stack0xffffffffffffff20,this,arg);
      ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          in_stack_ffffffffffffff20._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
        operator_delete(in_stack_ffffffffffffff20._M_p);
      }
      local_78 = uVar15;
      bVar16 = Compiler::has_extended_decoration
                         ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler);
      pSVar8 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + (arg->type).id);
      if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0x11 && !bVar16) {
        pMVar10 = find_constexpr_sampler(this,(uint32_t)local_78);
        uVar7 = 1;
        if ((pMVar10 != (MSLConstexprSampler *)0x0) && (pMVar10->ycbcr_conversion_enable == true)) {
          uVar7 = pMVar10->planes;
        }
        local_70._M_dataplus._M_p._0_4_ = 1;
        if (1 < uVar7) {
          do {
            argument_decl_abi_cxx11_(&local_98,this,arg);
            in_R8 = &local_70;
            join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                      ((string *)&stack0xffffffffffffff20,(spirv_cross *)0x35f4cc,
                       (char (*) [3])&local_98,local_40,in_R8,(uint *)in_R9);
            ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p)
            ;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffff20._M_p !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
              operator_delete(in_stack_ffffffffffffff20._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            local_70._M_dataplus._M_p._0_4_ = (uint)local_70._M_dataplus._M_p + 1;
          } while ((uint)local_70._M_dataplus._M_p < uVar7);
        }
        if ((pSVar8->image).dim != DimBuffer) {
          if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            sampler_type_abi_cxx11_(&local_98,this,pSVar8,(arg->id).id);
            in_R8 = &local_70;
            to_sampler_expression_abi_cxx11_(in_R8,this,(arg->id).id);
            join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                      ((string *)&stack0xffffffffffffff20,(spirv_cross *)0x35f4cc,
                       (char (*) [3])&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37
                       ,(char (*) [2])in_R8,in_R9);
            ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p)
            ;
          }
          else {
            local_38 = descriptor_address_space
                                 (this,(uint32_t)local_78,StorageClassUniformConstant,"thread const"
                                 );
            sampler_type_abi_cxx11_(&local_98,this,pSVar8,(arg->id).id);
            to_sampler_expression_abi_cxx11_(&local_70,this,(arg->id).id);
            in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35e1eb;
            in_R8 = &local_98;
            join<char_const(&)[3],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                      ((string *)&stack0xffffffffffffff20,(spirv_cross *)0x35f4cc,
                       (char (*) [3])&local_38,(char **)0x348c37,(char (*) [2])&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35e1eb
                       ,(char (*) [3])&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff20._M_p);
            ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p)
            ;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              in_stack_ffffffffffffff20._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
            operator_delete(in_stack_ffffffffffffff20._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(uint)local_70._M_dataplus._M_p) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_70._M_dataplus._M_p._4_4_,(uint)local_70._M_dataplus._M_p
                                    ));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
        }
      }
      if (((this->msl_options).swizzle_texture_samples == true) &&
         (this->has_sampled_images == true)) {
        bVar6 = Compiler::is_sampled_image_type((Compiler *)this,pSVar8);
        if (!bVar16 && bVar6) {
          sVar2 = (pSVar8->array).super_VectorView<unsigned_int>.buffer_size;
          to_swizzle_expression_abi_cxx11_(&local_98,this,(arg->id).id);
          pacVar12 = (char (*) [16])0x35f3b6;
          if (sVar2 == 0) {
            pacVar12 = (char (*) [16])0x35e1eb;
          }
          join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                    ((string *)&stack0xffffffffffffff20,(spirv_cross *)", constant uint",pacVar12,
                     (char (*) [3])&local_98,in_R8);
          ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              in_stack_ffffffffffffff20._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
            operator_delete(in_stack_ffffffffffffff20._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
        }
      }
      in_stack_ffffffffffffff20._M_p._4_4_ =
           (undefined4)((ulong)in_stack_ffffffffffffff20._M_p >> 0x20);
      in_stack_ffffffffffffff20._M_p._0_4_ = (int)local_78;
      sVar11 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(local_48,(key_type *)&stack0xffffffffffffff20);
      if (sVar11 != 0) {
        sVar2 = (pSVar8->array).super_VectorView<unsigned_int>.buffer_size;
        to_buffer_size_expression_abi_cxx11_(&local_98,this,(uint32_t)local_78);
        pacVar12 = (char (*) [16])0x35f3b6;
        if (sVar2 == 0) {
          pacVar12 = (char (*) [16])0x35e1eb;
        }
        join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                  ((string *)&stack0xffffffffffffff20,(spirv_cross *)", constant uint",pacVar12,
                   (char (*) [3])&local_98,in_R8);
        ::std::__cxx11::string::_M_append(local_d0 + 0x18,(ulong)in_stack_ffffffffffffff20._M_p);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            in_stack_ffffffffffffff20._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
          operator_delete(in_stack_ffffffffffffff20._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
      }
      if (arg != (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                  (local_d0._16_8_ + 0x18))->super_VectorView<spirv_cross::SPIRFunction::Parameter>)
                 .ptr + (*(size_t *)(local_d0._16_8_ + 0x20) - 1)) {
        ::std::__cxx11::string::append(local_d0 + 0x18);
      }
      arg = arg + 1;
    } while (arg != local_50);
  }
  ::std::__cxx11::string::append(local_d0 + 0x18);
  CompilerGLSL::statement<std::__cxx11::string&>
            (&this->super_CompilerGLSL,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_d0 + 0x18))
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._24_8_ != &local_a8) {
    operator_delete((void *)local_d0._24_8_);
  }
  return;
}

Assistant:

void CompilerMSL::emit_function_prototype(SPIRFunction &func, const Bitset &)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	local_variable_names = resource_names;
	string decl;

	processing_entry_point = func.self == ir.default_entry_point;

	// Metal helper functions must be static force-inline otherwise they will cause problems when linked together in a single Metallib.
	if (!processing_entry_point)
		statement(force_inline);

	auto &type = get<SPIRType>(func.return_type);

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// We cannot return native arrays in MSL, so "return" through an out variable.
		decl += "void";
	}
	else
	{
		decl += func_type_decl(type);
	}

	decl += " ";
	decl += to_name(func.self);
	decl += "(";

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// Fake arrays returns by writing to an out array instead.
		decl += "thread ";
		decl += type_to_glsl(type);
		decl += " (&spvReturnValue)";
		decl += type_to_array_glsl(type);
		if (!func.arguments.empty())
			decl += ", ";
	}

	if (processing_entry_point)
	{
		if (msl_options.argument_buffers)
			decl += entry_point_args_argument_buffer(!func.arguments.empty());
		else
			decl += entry_point_args_classic(!func.arguments.empty());

		// append entry point args to avoid conflicts in local variable names.
		local_variable_names.insert(resource_names.begin(), resource_names.end());

		// If entry point function has variables that require early declaration,
		// ensure they each have an empty initializer, creating one if needed.
		// This is done at this late stage because the initialization expression
		// is cleared after each compilation pass.
		for (auto var_id : vars_needing_early_declaration)
		{
			auto &ed_var = get<SPIRVariable>(var_id);
			ID &initializer = ed_var.initializer;
			if (!initializer)
				initializer = ir.increase_bound_by(1);

			// Do not override proper initializers.
			if (ir.ids[initializer].get_type() == TypeNone || ir.ids[initializer].get_type() == TypeExpression)
				set<SPIRExpression>(ed_var.initializer, "{}", ed_var.basetype, true);
		}
	}

	for (auto &arg : func.arguments)
	{
		uint32_t name_id = arg.id;

		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
		{
			// If we need to modify the name of the variable, make sure we modify the original variable.
			// Our alias is just a shadow variable.
			if (arg.alias_global_variable && var->basevariable)
				name_id = var->basevariable;

			var->parameter = &arg; // Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		}

		add_local_variable_name(name_id);

		decl += argument_decl(arg);

		bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);

		auto &arg_type = get<SPIRType>(arg.type);
		if (arg_type.basetype == SPIRType::SampledImage && !is_dynamic_img_sampler)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (auto *constexpr_sampler = find_constexpr_sampler(name_id))
				if (constexpr_sampler->ycbcr_conversion_enable)
					planes = constexpr_sampler->planes;
			for (uint32_t i = 1; i < planes; i++)
				decl += join(", ", argument_decl(arg), plane_name_suffix, i);

			// Manufacture automatic sampler arg for SampledImage texture
			if (arg_type.image.dim != DimBuffer)
			{
				if (arg_type.array.empty())
				{
					decl += join(", ", sampler_type(arg_type, arg.id), " ", to_sampler_expression(arg.id));
				}
				else
				{
					const char *sampler_address_space =
							descriptor_address_space(name_id,
							                         StorageClassUniformConstant,
							                         "thread const");
					decl += join(", ", sampler_address_space, " ", sampler_type(arg_type, arg.id), "& ", to_sampler_expression(arg.id));
				}
			}
		}

		// Manufacture automatic swizzle arg.
		if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(arg_type) &&
		    !is_dynamic_img_sampler)
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_swizzle_expression(arg.id));
		}

		if (buffer_requires_array_length(name_id))
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_buffer_size_expression(name_id));
		}

		if (&arg != &func.arguments.back())
			decl += ", ";
	}

	decl += ")";
	statement(decl);
}